

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcStair::~IfcStair(IfcStair *this)

{
  ~IfcStair((IfcStair *)&this[-1].field_0x48);
  return;
}

Assistant:

IfcStair() : Object("IfcStair") {}